

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O1

bool __thiscall ON_SubDMeshFragmentIterator::IsEmpty(ON_SubDMeshFragmentIterator *this)

{
  element_type *peVar1;
  ulong uVar2;
  ON_SubDMeshFragment *pOVar3;
  ON_SubDFace *this_00;
  ON_SubDFaceIterator local_fit;
  ON_SubDFaceIterator OStack_48;
  
  if (this->m_bFromFaceFragments == true) {
    ON_SubDRef::ON_SubDRef(&OStack_48.m_subd_ref,&(this->m_fit).m_subd_ref);
    this_00 = (this->m_fit).m_face_first;
    OStack_48.m_face_last = (this->m_fit).m_face_last;
    uVar2._0_4_ = (this->m_fit).m_face_index;
    uVar2._4_4_ = (this->m_fit).m_face_count;
    OStack_48.m_component_ptr.m_ptr = (this->m_fit).m_component_ptr.m_ptr;
    OStack_48._40_8_ = uVar2 & 0xffffffff00000000;
    OStack_48.m_face_first = this_00;
    OStack_48.m_face_current = this_00;
    while ((pOVar3 = (ON_SubDMeshFragment *)0x0, this_00 != (ON_SubDFace *)0x0 &&
           (pOVar3 = ON_SubDFace::MeshFragments(this_00), pOVar3 == (ON_SubDMeshFragment *)0x0))) {
      this_00 = ON_SubDFaceIterator::NextFace(&OStack_48);
    }
    ON_SubDRef::~ON_SubDRef(&OStack_48.m_subd_ref);
  }
  else {
    peVar1 = (this->m_limit_mesh).m_impl_sp.
             super___shared_ptr<ON_SubDMeshImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 == (element_type *)0x0) {
      pOVar3 = (ON_SubDMeshFragment *)0x0;
    }
    else {
      pOVar3 = peVar1->m_first_fragment;
    }
  }
  return pOVar3 == (ON_SubDMeshFragment *)0x0;
}

Assistant:

bool ON_SubDMeshFragmentIterator::IsEmpty() const
{
  const ON_SubDMeshFragment* f0 = nullptr;
  if (m_bFromFaceFragments)
  {
    ON_SubDFaceIterator local_fit(m_fit); // cannot modify fit
    for (const ON_SubDFace* f = local_fit.FirstFace(); nullptr != f; f = local_fit.NextFace())
    {
      f0 = f->MeshFragments();
      if (nullptr != f0)
        break;
    }
  }
  else
  {
    f0 = m_limit_mesh.FirstFragment();
  }
  return (nullptr == f0);
}